

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall
Pubkey_DefaultConstructorTest_Test::TestBody(Pubkey_DefaultConstructorTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  allocator local_89;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  string local_70;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  Pubkey pubkey;
  
  cfd::core::Pubkey::Pubkey(&pubkey);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_70,&pubkey);
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"\"","pubkey.GetHex().c_str()","",local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::core::Pubkey::IsCompress(&pubkey);
  gtest_ar.success_ = !bVar1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar,(AssertionResult *)"pubkey.IsCompress()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x43,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = cfd::core::Pubkey::IsValid(&pubkey);
  gtest_ar.success_ = !bVar1;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar,(AssertionResult *)0x412c04,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x44,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Pubkey::GetData((ByteData *)&gtest_ar,&pubkey);
  std::__cxx11::string::string((string *)&local_70,"",&local_89);
  cfd::core::ByteData::ByteData((ByteData *)&local_88,&local_70);
  bVar1 = cfd::core::ByteData::Equals((ByteData *)&gtest_ar,(ByteData *)&local_88);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__2.success_ = bVar1;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  std::__cxx11::string::~string((string *)&local_70);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar__2,
               (AssertionResult *)"pubkey.GetData().Equals(ByteData(\"\"))","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0x45,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    std::__cxx11::string::~string((string *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  return;
}

Assistant:

TEST(Pubkey, DefaultConstructorTest) {
  Pubkey pubkey = Pubkey();

  EXPECT_STREQ("", pubkey.GetHex().c_str());
  EXPECT_FALSE(pubkey.IsCompress());
  EXPECT_FALSE(pubkey.IsValid());
  EXPECT_TRUE(pubkey.GetData().Equals(ByteData("")));
}